

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O2

void __thiscall QTemporaryDir::~QTemporaryDir(QTemporaryDir *this)

{
  QTemporaryDirPrivate *this_00;
  char *in_RSI;
  
  this_00 = this->d_ptr;
  if (this_00 == (QTemporaryDirPrivate *)0x0) {
    return;
  }
  if (this_00->autoRemove == true) {
    remove(this,in_RSI);
    this_00 = this->d_ptr;
    if (this_00 == (QTemporaryDirPrivate *)0x0) {
      this_00 = (QTemporaryDirPrivate *)0x0;
      goto LAB_0023cdb4;
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
LAB_0023cdb4:
  operator_delete(this_00,0x20);
  return;
}

Assistant:

QTemporaryDir::~QTemporaryDir()
{
    if (d_ptr) {
        if (d_ptr->autoRemove)
            remove();

        delete d_ptr;
    }
}